

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

void __thiscall winmd::reader::table_base::set_data(table_base *this,byte_view *view)

{
  byte_view local_18;
  
  if (this->m_row_count != 0) {
    this->m_data = view->m_first;
    byte_view::seek(&local_18,(uint32_t)view);
    view->m_first = local_18.m_first;
    view->m_last = local_18.m_last;
  }
  return;
}

Assistant:

void set_data(byte_view& view) noexcept
        {
            XLANG_ASSERT(!m_data);

            if (m_row_count)
            {
                XLANG_ASSERT(m_row_size);
                m_data = view.begin();
                view = view.seek(m_row_count * m_row_size);
            }
        }